

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_start_compress
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                   opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_image_comp_t *poVar2;
  long lVar3;
  OPJ_BOOL OVar4;
  opj_image_t *p_image_dest;
  long lVar5;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2c60,
                  "OPJ_BOOL opj_j2k_start_compress(opj_j2k_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2c61,
                  "OPJ_BOOL opj_j2k_start_compress(opj_j2k_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2c62,
                  "OPJ_BOOL opj_j2k_start_compress(opj_j2k_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
                 );
  }
  p_image_dest = opj_image_create0();
  p_j2k->m_private_image = p_image_dest;
  if (p_image_dest == (opj_image_t *)0x0) {
    opj_event_msg(p_manager,1,"Failed to allocate image header.");
  }
  else {
    opj_copy_image_header(p_image,p_image_dest);
    poVar2 = p_image->comps;
    if ((poVar2 != (opj_image_comp_t *)0x0) && (uVar1 = p_image->numcomps, (ulong)uVar1 != 0)) {
      lVar5 = 0;
      do {
        lVar3 = *(long *)((long)&poVar2->data + lVar5);
        if (lVar3 != 0) {
          *(long *)((long)&p_j2k->m_private_image->comps->data + lVar5) = lVar3;
          *(undefined8 *)((long)&poVar2->data + lVar5) = 0;
        }
        lVar5 = lVar5 + 0x40;
      } while ((ulong)uVar1 << 6 != lVar5);
    }
    OVar4 = opj_procedure_list_add_procedure
                      (p_j2k->m_validation_list,opj_j2k_build_encoder,p_manager);
    if ((((((OVar4 != 0) &&
           (OVar4 = opj_procedure_list_add_procedure
                              (p_j2k->m_validation_list,opj_j2k_encoding_validation,p_manager),
           OVar4 != 0)) &&
          (OVar4 = opj_procedure_list_add_procedure
                             (p_j2k->m_validation_list,opj_j2k_mct_validation,p_manager), OVar4 != 0
          )) && ((OVar4 = opj_j2k_exec(p_j2k,p_j2k->m_validation_list,p_stream,p_manager),
                 OVar4 != 0 &&
                 (OVar4 = opj_procedure_list_add_procedure
                                    (p_j2k->m_procedure_list,opj_j2k_init_info,p_manager),
                 OVar4 != 0)))) &&
        ((OVar4 = opj_procedure_list_add_procedure
                            (p_j2k->m_procedure_list,opj_j2k_write_soc,p_manager), OVar4 != 0 &&
         ((OVar4 = opj_procedure_list_add_procedure
                             (p_j2k->m_procedure_list,opj_j2k_write_siz,p_manager), OVar4 != 0 &&
          (OVar4 = opj_procedure_list_add_procedure
                             (p_j2k->m_procedure_list,opj_j2k_write_cod,p_manager), OVar4 != 0))))))
       && ((OVar4 = opj_procedure_list_add_procedure
                              (p_j2k->m_procedure_list,opj_j2k_write_qcd,p_manager), OVar4 != 0 &&
           ((OVar4 = opj_procedure_list_add_procedure
                               (p_j2k->m_procedure_list,opj_j2k_write_all_coc,p_manager), OVar4 != 0
            && (OVar4 = opj_procedure_list_add_procedure
                                  (p_j2k->m_procedure_list,opj_j2k_write_all_qcc,p_manager),
               OVar4 != 0)))))) {
      if ((ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U) < 4) {
        OVar4 = opj_procedure_list_add_procedure
                          (p_j2k->m_procedure_list,opj_j2k_write_tlm,p_manager);
        if (OVar4 == 0) {
          return 0;
        }
        if (((p_j2k->m_cp).rsiz == 4) &&
           (OVar4 = opj_procedure_list_add_procedure
                              (p_j2k->m_procedure_list,opj_j2k_write_poc,p_manager), OVar4 == 0)) {
          return 0;
        }
      }
      OVar4 = opj_procedure_list_add_procedure
                        (p_j2k->m_procedure_list,opj_j2k_write_regions,p_manager);
      if (OVar4 != 0) {
        if (((p_j2k->m_cp).comment != (OPJ_CHAR *)0x0) &&
           (OVar4 = opj_procedure_list_add_procedure
                              (p_j2k->m_procedure_list,opj_j2k_write_com,p_manager), OVar4 == 0)) {
          return 0;
        }
        if ((((p_j2k->m_cp).rsiz & 0x100) != 0) &&
           (OVar4 = opj_procedure_list_add_procedure
                              (p_j2k->m_procedure_list,opj_j2k_write_mct_data_group,p_manager),
           OVar4 == 0)) {
          return 0;
        }
        if ((p_j2k->cstr_index != (opj_codestream_index_t *)0x0) &&
           (OVar4 = opj_procedure_list_add_procedure
                              (p_j2k->m_procedure_list,opj_j2k_get_end_header,p_manager), OVar4 == 0
           )) {
          return 0;
        }
        OVar4 = opj_procedure_list_add_procedure
                          (p_j2k->m_procedure_list,opj_j2k_create_tcd,p_manager);
        if ((OVar4 != 0) &&
           (OVar4 = opj_procedure_list_add_procedure
                              (p_j2k->m_procedure_list,opj_j2k_update_rates,p_manager), OVar4 != 0))
        {
          OVar4 = opj_j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
          return OVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_start_compress(opj_j2k_t *p_j2k,
                                opj_stream_private_t *p_stream,
                                opj_image_t * p_image,
                                opj_event_mgr_t * p_manager)
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    p_j2k->m_private_image = opj_image_create0();
    if (! p_j2k->m_private_image) {
        opj_event_msg(p_manager, EVT_ERROR, "Failed to allocate image header.");
        return OPJ_FALSE;
    }
    opj_copy_image_header(p_image, p_j2k->m_private_image);

    /* TODO_MSD: Find a better way */
    if (p_image->comps) {
        OPJ_UINT32 it_comp;
        for (it_comp = 0 ; it_comp < p_image->numcomps; it_comp++) {
            if (p_image->comps[it_comp].data) {
                p_j2k->m_private_image->comps[it_comp].data = p_image->comps[it_comp].data;
                p_image->comps[it_comp].data = NULL;

            }
        }
    }

    /* customization of the validation */
    if (! opj_j2k_setup_encoding_validation(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    /* validation of the parameters codec */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_validation_list, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    /* customization of the encoding */
    if (! opj_j2k_setup_header_writing(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    /* write header */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_procedure_list, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}